

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_single(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  int iVar69;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar70 [16];
  int i_2;
  int j;
  int i_1;
  int k;
  int i;
  uint32_t pos;
  uint32_t n_update_cycles;
  uint32_t n_cycles;
  __m256i *data_vectors;
  uint32_t out_counters [16];
  __m256i masks;
  __m256i one_mask;
  __m256i counter;
  int local_16c8;
  int local_16c4;
  uint local_16c0;
  int local_16bc;
  uint local_16b8;
  uint local_16b4;
  int local_16a0 [16];
  undefined1 local_1660 [16];
  undefined1 auStack_1650 [16];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined1 local_1620 [24];
  undefined8 uStack_1608;
  long local_1600;
  uint local_15f4;
  long local_15f0;
  undefined2 local_15c4;
  undefined2 local_15c2;
  undefined1 local_940 [16];
  undefined1 auStack_930 [16];
  undefined2 local_920;
  undefined2 local_91e;
  undefined2 local_91c;
  undefined2 local_91a;
  undefined2 local_918;
  undefined2 local_916;
  undefined2 local_914;
  undefined2 local_912;
  undefined2 local_910;
  undefined2 local_90e;
  undefined2 local_90c;
  undefined2 local_90a;
  undefined2 local_908;
  undefined2 local_906;
  undefined2 local_904;
  undefined2 local_902;
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined2 local_8e0;
  undefined2 local_8de;
  undefined2 local_8dc;
  undefined2 local_8da;
  undefined2 local_8d8;
  undefined2 local_8d6;
  undefined2 local_8d4;
  undefined2 local_8d2;
  undefined2 local_8d0;
  undefined2 local_8ce;
  undefined2 local_8cc;
  undefined2 local_8ca;
  undefined2 local_8c8;
  undefined2 local_8c6;
  undefined2 local_8c4;
  undefined2 local_8c2;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_480 [32];
  undefined2 local_460;
  undefined2 local_45e;
  undefined2 local_45c;
  undefined2 local_45a;
  undefined2 local_458;
  undefined2 local_456;
  undefined2 local_454;
  undefined2 local_452;
  undefined2 local_450;
  undefined2 local_44e;
  undefined2 local_44c;
  undefined2 local_44a;
  undefined2 local_448;
  undefined2 local_446;
  undefined2 local_444;
  undefined2 local_442;
  
  local_15c2 = 0;
  local_902 = 0;
  local_904 = 0;
  local_906 = 0;
  local_908 = 0;
  local_90a = 0;
  local_90c = 0;
  local_90e = 0;
  local_910 = 0;
  local_912 = 0;
  local_914 = 0;
  local_916 = 0;
  local_918 = 0;
  local_91a = 0;
  local_91c = 0;
  local_91e = 0;
  local_920 = 0;
  auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
  auVar2 = vpinsrw_avx(auVar2,0,2);
  auVar2 = vpinsrw_avx(auVar2,0,3);
  auVar2 = vpinsrw_avx(auVar2,0,4);
  auVar2 = vpinsrw_avx(auVar2,0,5);
  auVar2 = vpinsrw_avx(auVar2,0,6);
  local_940 = vpinsrw_avx(auVar2,0,7);
  auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
  auVar2 = vpinsrw_avx(auVar2,0,2);
  auVar2 = vpinsrw_avx(auVar2,0,3);
  auVar2 = vpinsrw_avx(auVar2,0,4);
  auVar2 = vpinsrw_avx(auVar2,0,5);
  auVar2 = vpinsrw_avx(auVar2,0,6);
  auStack_930 = vpinsrw_avx(auVar2,0,7);
  local_1620._16_8_ = auStack_930._0_8_;
  local_1620._0_16_ = local_940;
  uStack_1608 = auStack_930._8_8_;
  local_15c4 = 1;
  local_8c2 = 1;
  local_8c4 = 1;
  local_8c6 = 1;
  local_8c8 = 1;
  local_8ca = 1;
  local_8cc = 1;
  local_8ce = 1;
  local_8d0 = 1;
  local_8d2 = 1;
  local_8d4 = 1;
  local_8d6 = 1;
  local_8d8 = 1;
  local_8da = 1;
  local_8dc = 1;
  local_8de = 1;
  local_8e0 = 1;
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  local_900 = vpinsrw_avx(auVar2,1,7);
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  auStack_8f0 = vpinsrw_avx(auVar2,1,7);
  local_1640 = local_900._0_8_;
  uStack_1638 = local_900._8_8_;
  uStack_1630 = auStack_8f0._0_8_;
  uStack_1628 = auStack_8f0._8_8_;
  local_442 = 0x8000;
  local_444 = 0x4000;
  local_446 = 0x2000;
  local_448 = 0x1000;
  local_44a = 0x800;
  local_44c = 0x400;
  local_44e = 0x200;
  local_450 = 0x100;
  local_452 = 0x80;
  local_454 = 0x40;
  local_456 = 0x20;
  local_458 = 0x10;
  local_45a = 8;
  local_45c = 4;
  local_45e = 2;
  local_460 = 1;
  auVar2 = vpinsrw_avx(ZEXT216(0x100),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x400,2);
  auVar2 = vpinsrw_avx(auVar2,0x800,3);
  auVar2 = vpinsrw_avx(auVar2,0x1000,4);
  auVar2 = vpinsrw_avx(auVar2,0x2000,5);
  auVar2 = vpinsrw_avx(auVar2,0x4000,6);
  auVar2 = vpinsrw_avx(auVar2,0x8000,7);
  auVar3 = vpinsrw_avx(ZEXT216(1),2,1);
  auVar3 = vpinsrw_avx(auVar3,4,2);
  auVar3 = vpinsrw_avx(auVar3,8,3);
  auVar3 = vpinsrw_avx(auVar3,0x10,4);
  auVar3 = vpinsrw_avx(auVar3,0x20,5);
  auVar3 = vpinsrw_avx(auVar3,0x40,6);
  auVar3 = vpinsrw_avx(auVar3,0x80,7);
  local_480._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  local_480._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  local_1600 = in_RDX;
  local_15f4 = in_ESI;
  local_15f0 = in_RDI;
  local_1660 = local_480._0_16_;
  auStack_1650 = local_480._16_16_;
  memset(local_16a0,0,0x40);
  local_16b4 = 0;
  for (local_16b8 = 0; local_16b8 < local_15f4 >> 0x10; local_16b8 = local_16b8 + 1) {
    for (local_16bc = 0; local_16bc < 0x1000; local_16bc = local_16bc + 1) {
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_8b0 = auVar3._0_8_;
      uStack_8a8 = auVar3._8_8_;
      auVar52._16_8_ = uStack_8b0;
      auVar52._0_16_ = auVar2;
      auVar52._24_8_ = uStack_8a8;
      auVar4._16_8_ = auStack_1650._0_8_;
      auVar4._0_16_ = local_1660;
      auVar4._24_8_ = auStack_1650._8_8_;
      auVar4 = vpand_avx2(auVar52,auVar4);
      auVar68._16_8_ = auStack_1650._0_8_;
      auVar68._0_16_ = local_1660;
      auVar68._24_8_ = auStack_1650._8_8_;
      auVar4 = vpcmpeqw_avx2(auVar4,auVar68);
      auVar51._8_8_ = uStack_1638;
      auVar51._0_8_ = local_1640;
      auVar51._16_8_ = uStack_1630;
      auVar51._24_8_ = uStack_1628;
      auVar4 = vpand_avx2(auVar4,auVar51);
      auVar4 = vpaddw_avx2(_local_1620,auVar4);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 2);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_870 = auVar3._0_8_;
      uStack_868 = auVar3._8_8_;
      auVar50._16_8_ = uStack_870;
      auVar50._0_16_ = auVar2;
      auVar50._24_8_ = uStack_868;
      auVar49._16_8_ = auStack_1650._0_8_;
      auVar49._0_16_ = local_1660;
      auVar49._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar50,auVar49);
      auVar67._16_8_ = auStack_1650._0_8_;
      auVar67._0_16_ = local_1660;
      auVar67._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar67);
      auVar48._8_8_ = uStack_1638;
      auVar48._0_8_ = local_1640;
      auVar48._16_8_ = uStack_1630;
      auVar48._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar48);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 4);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_830 = auVar3._0_8_;
      uStack_828 = auVar3._8_8_;
      auVar47._16_8_ = uStack_830;
      auVar47._0_16_ = auVar2;
      auVar47._24_8_ = uStack_828;
      auVar46._16_8_ = auStack_1650._0_8_;
      auVar46._0_16_ = local_1660;
      auVar46._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar47,auVar46);
      auVar66._16_8_ = auStack_1650._0_8_;
      auVar66._0_16_ = local_1660;
      auVar66._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar66);
      auVar45._8_8_ = uStack_1638;
      auVar45._0_8_ = local_1640;
      auVar45._16_8_ = uStack_1630;
      auVar45._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar45);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 6);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_7f0 = auVar3._0_8_;
      uStack_7e8 = auVar3._8_8_;
      auVar44._16_8_ = uStack_7f0;
      auVar44._0_16_ = auVar2;
      auVar44._24_8_ = uStack_7e8;
      auVar43._16_8_ = auStack_1650._0_8_;
      auVar43._0_16_ = local_1660;
      auVar43._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar44,auVar43);
      auVar65._16_8_ = auStack_1650._0_8_;
      auVar65._0_16_ = local_1660;
      auVar65._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar65);
      auVar42._8_8_ = uStack_1638;
      auVar42._0_8_ = local_1640;
      auVar42._16_8_ = uStack_1630;
      auVar42._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar42);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 8);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_7b0 = auVar3._0_8_;
      uStack_7a8 = auVar3._8_8_;
      auVar41._16_8_ = uStack_7b0;
      auVar41._0_16_ = auVar2;
      auVar41._24_8_ = uStack_7a8;
      auVar40._16_8_ = auStack_1650._0_8_;
      auVar40._0_16_ = local_1660;
      auVar40._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar41,auVar40);
      auVar64._16_8_ = auStack_1650._0_8_;
      auVar64._0_16_ = local_1660;
      auVar64._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar64);
      auVar39._8_8_ = uStack_1638;
      auVar39._0_8_ = local_1640;
      auVar39._16_8_ = uStack_1630;
      auVar39._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar39);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 10);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_770 = auVar3._0_8_;
      uStack_768 = auVar3._8_8_;
      auVar38._16_8_ = uStack_770;
      auVar38._0_16_ = auVar2;
      auVar38._24_8_ = uStack_768;
      auVar37._16_8_ = auStack_1650._0_8_;
      auVar37._0_16_ = local_1660;
      auVar37._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar38,auVar37);
      auVar63._16_8_ = auStack_1650._0_8_;
      auVar63._0_16_ = local_1660;
      auVar63._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar63);
      auVar36._8_8_ = uStack_1638;
      auVar36._0_8_ = local_1640;
      auVar36._16_8_ = uStack_1630;
      auVar36._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar36);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0xc);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_730 = auVar3._0_8_;
      uStack_728 = auVar3._8_8_;
      auVar35._16_8_ = uStack_730;
      auVar35._0_16_ = auVar2;
      auVar35._24_8_ = uStack_728;
      auVar34._16_8_ = auStack_1650._0_8_;
      auVar34._0_16_ = local_1660;
      auVar34._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar35,auVar34);
      auVar62._16_8_ = auStack_1650._0_8_;
      auVar62._0_16_ = local_1660;
      auVar62._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar62);
      auVar33._8_8_ = uStack_1638;
      auVar33._0_8_ = local_1640;
      auVar33._16_8_ = uStack_1630;
      auVar33._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar33);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0xe);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_6f0 = auVar3._0_8_;
      uStack_6e8 = auVar3._8_8_;
      auVar32._16_8_ = uStack_6f0;
      auVar32._0_16_ = auVar2;
      auVar32._24_8_ = uStack_6e8;
      auVar31._16_8_ = auStack_1650._0_8_;
      auVar31._0_16_ = local_1660;
      auVar31._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar32,auVar31);
      auVar61._16_8_ = auStack_1650._0_8_;
      auVar61._0_16_ = local_1660;
      auVar61._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar61);
      auVar30._8_8_ = uStack_1638;
      auVar30._0_8_ = local_1640;
      auVar30._16_8_ = uStack_1630;
      auVar30._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar30);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0x10);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_6b0 = auVar3._0_8_;
      uStack_6a8 = auVar3._8_8_;
      auVar29._16_8_ = uStack_6b0;
      auVar29._0_16_ = auVar2;
      auVar29._24_8_ = uStack_6a8;
      auVar28._16_8_ = auStack_1650._0_8_;
      auVar28._0_16_ = local_1660;
      auVar28._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar29,auVar28);
      auVar60._16_8_ = auStack_1650._0_8_;
      auVar60._0_16_ = local_1660;
      auVar60._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar60);
      auVar27._8_8_ = uStack_1638;
      auVar27._0_8_ = local_1640;
      auVar27._16_8_ = uStack_1630;
      auVar27._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar27);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0x12);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_670 = auVar3._0_8_;
      uStack_668 = auVar3._8_8_;
      auVar26._16_8_ = uStack_670;
      auVar26._0_16_ = auVar2;
      auVar26._24_8_ = uStack_668;
      auVar25._16_8_ = auStack_1650._0_8_;
      auVar25._0_16_ = local_1660;
      auVar25._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar26,auVar25);
      auVar59._16_8_ = auStack_1650._0_8_;
      auVar59._0_16_ = local_1660;
      auVar59._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar59);
      auVar24._8_8_ = uStack_1638;
      auVar24._0_8_ = local_1640;
      auVar24._16_8_ = uStack_1630;
      auVar24._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar24);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0x14);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_630 = auVar3._0_8_;
      uStack_628 = auVar3._8_8_;
      auVar23._16_8_ = uStack_630;
      auVar23._0_16_ = auVar2;
      auVar23._24_8_ = uStack_628;
      auVar22._16_8_ = auStack_1650._0_8_;
      auVar22._0_16_ = local_1660;
      auVar22._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar23,auVar22);
      auVar58._16_8_ = auStack_1650._0_8_;
      auVar58._0_16_ = local_1660;
      auVar58._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar58);
      auVar21._8_8_ = uStack_1638;
      auVar21._0_8_ = local_1640;
      auVar21._16_8_ = uStack_1630;
      auVar21._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar21);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0x16);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_5f0 = auVar3._0_8_;
      uStack_5e8 = auVar3._8_8_;
      auVar20._16_8_ = uStack_5f0;
      auVar20._0_16_ = auVar2;
      auVar20._24_8_ = uStack_5e8;
      auVar19._16_8_ = auStack_1650._0_8_;
      auVar19._0_16_ = local_1660;
      auVar19._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar20,auVar19);
      auVar57._16_8_ = auStack_1650._0_8_;
      auVar57._0_16_ = local_1660;
      auVar57._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar57);
      auVar18._8_8_ = uStack_1638;
      auVar18._0_8_ = local_1640;
      auVar18._16_8_ = uStack_1630;
      auVar18._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar18);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0x18);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_5b0 = auVar3._0_8_;
      uStack_5a8 = auVar3._8_8_;
      auVar17._16_8_ = uStack_5b0;
      auVar17._0_16_ = auVar2;
      auVar17._24_8_ = uStack_5a8;
      auVar16._16_8_ = auStack_1650._0_8_;
      auVar16._0_16_ = local_1660;
      auVar16._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar17,auVar16);
      auVar56._16_8_ = auStack_1650._0_8_;
      auVar56._0_16_ = local_1660;
      auVar56._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar56);
      auVar15._8_8_ = uStack_1638;
      auVar15._0_8_ = local_1640;
      auVar15._16_8_ = uStack_1630;
      auVar15._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar15);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0x1a);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_570 = auVar3._0_8_;
      uStack_568 = auVar3._8_8_;
      auVar14._16_8_ = uStack_570;
      auVar14._0_16_ = auVar2;
      auVar14._24_8_ = uStack_568;
      auVar13._16_8_ = auStack_1650._0_8_;
      auVar13._0_16_ = local_1660;
      auVar13._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar14,auVar13);
      auVar55._16_8_ = auStack_1650._0_8_;
      auVar55._0_16_ = local_1660;
      auVar55._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar55);
      auVar12._8_8_ = uStack_1638;
      auVar12._0_8_ = local_1640;
      auVar12._16_8_ = uStack_1630;
      auVar12._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar12);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0x1c);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_530 = auVar3._0_8_;
      uStack_528 = auVar3._8_8_;
      auVar11._16_8_ = uStack_530;
      auVar11._0_16_ = auVar2;
      auVar11._24_8_ = uStack_528;
      auVar10._16_8_ = auStack_1650._0_8_;
      auVar10._0_16_ = local_1660;
      auVar10._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar11,auVar10);
      auVar54._16_8_ = auStack_1650._0_8_;
      auVar54._0_16_ = local_1660;
      auVar54._24_8_ = auStack_1650._8_8_;
      auVar5 = vpcmpeqw_avx2(auVar5,auVar54);
      auVar9._8_8_ = uStack_1638;
      auVar9._0_8_ = local_1640;
      auVar9._16_8_ = uStack_1630;
      auVar9._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar9);
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      uVar1 = *(ushort *)(local_15f0 + (ulong)local_16b4 * 0x20 + 0x1e);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      uStack_4f0 = auVar3._0_8_;
      uStack_4e8 = auVar3._8_8_;
      auVar8._16_8_ = uStack_4f0;
      auVar8._0_16_ = auVar2;
      auVar8._24_8_ = uStack_4e8;
      auVar5._16_8_ = auStack_1650._0_8_;
      auVar5._0_16_ = local_1660;
      auVar5._24_8_ = auStack_1650._8_8_;
      auVar5 = vpand_avx2(auVar8,auVar5);
      auVar53._16_8_ = auStack_1650._0_8_;
      auVar53._0_16_ = local_1660;
      auVar53._24_8_ = auStack_1650._8_8_;
      uVar6 = vpcmpeqw_avx512vl(auVar5,auVar53);
      auVar5 = vpmovm2w_avx512vl(uVar6);
      auVar7._8_8_ = uStack_1638;
      auVar7._0_8_ = local_1640;
      auVar7._16_8_ = uStack_1630;
      auVar7._24_8_ = uStack_1628;
      auVar5 = vpand_avx2(auVar5,auVar7);
      _local_1620 = vpaddw_avx2(auVar4,auVar5);
      local_16b4 = local_16b4 + 1;
    }
    iVar69 = vpextrw_avx(local_1620._0_16_,0);
    local_16a0[0] = local_16a0[0] + iVar69;
    iVar69 = vpextrw_avx(local_1620._0_16_,1);
    local_16a0[1] = local_16a0[1] + iVar69;
    iVar69 = vpextrw_avx(local_1620._0_16_,2);
    local_16a0[2] = local_16a0[2] + iVar69;
    iVar69 = vpextrw_avx(local_1620._0_16_,3);
    local_16a0[3] = local_16a0[3] + iVar69;
    iVar69 = vpextrw_avx(local_1620._0_16_,4);
    local_16a0[4] = local_16a0[4] + iVar69;
    iVar69 = vpextrw_avx(local_1620._0_16_,5);
    local_16a0[5] = local_16a0[5] + iVar69;
    iVar69 = vpextrw_avx(local_1620._0_16_,6);
    local_16a0[6] = local_16a0[6] + iVar69;
    iVar69 = vpextrw_avx(local_1620._0_16_,7);
    local_16a0[7] = local_16a0[7] + iVar69;
    iVar69 = vpextrw_avx(stack0xffffffffffffe9f0,0);
    local_16a0[8] = local_16a0[8] + iVar69;
    iVar69 = vpextrw_avx(stack0xffffffffffffe9f0,1);
    local_16a0[9] = local_16a0[9] + iVar69;
    iVar69 = vpextrw_avx(stack0xffffffffffffe9f0,2);
    local_16a0[10] = local_16a0[10] + iVar69;
    iVar69 = vpextrw_avx(stack0xffffffffffffe9f0,3);
    local_16a0[0xb] = local_16a0[0xb] + iVar69;
    iVar69 = vpextrw_avx(stack0xffffffffffffe9f0,4);
    local_16a0[0xc] = local_16a0[0xc] + iVar69;
    iVar69 = vpextrw_avx(stack0xffffffffffffe9f0,5);
    local_16a0[0xd] = local_16a0[0xd] + iVar69;
    iVar69 = vpextrw_avx(stack0xffffffffffffe9f0,6);
    local_16a0[0xe] = local_16a0[0xe] + iVar69;
    iVar69 = vpextrw_avx(stack0xffffffffffffe9f0,7);
    local_16a0[0xf] = local_16a0[0xf] + iVar69;
    auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar2 = vpinsrw_avx(auVar2,0,2);
    auVar2 = vpinsrw_avx(auVar2,0,3);
    auVar2 = vpinsrw_avx(auVar2,0,4);
    auVar2 = vpinsrw_avx(auVar2,0,5);
    auVar2 = vpinsrw_avx(auVar2,0,6);
    auVar2 = vpinsrw_avx(auVar2,0,7);
    auVar3 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar3 = vpinsrw_avx(auVar3,0,2);
    auVar3 = vpinsrw_avx(auVar3,0,3);
    auVar3 = vpinsrw_avx(auVar3,0,4);
    auVar3 = vpinsrw_avx(auVar3,0,5);
    auVar3 = vpinsrw_avx(auVar3,0,6);
    auVar3 = vpinsrw_avx(auVar3,0,7);
    auVar70 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    uStack_4b0 = auVar70._0_8_;
    uStack_4a8 = auVar70._8_8_;
    local_1620._16_8_ = uStack_4b0;
    local_1620._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    uStack_1608 = uStack_4a8;
  }
  for (local_16c0 = local_16b4 << 4; local_16c0 < local_15f4; local_16c0 = local_16c0 + 1) {
    for (local_16c4 = 0; local_16c4 < 0x10; local_16c4 = local_16c4 + 1) {
      local_16a0[local_16c4] =
           ((int)((uint)*(ushort *)(local_15f0 + (long)(int)local_16c0 * 2) &
                 1 << ((byte)local_16c4 & 0x1f)) >> ((byte)local_16c4 & 0x1f)) +
           local_16a0[local_16c4];
    }
  }
  for (local_16c8 = 0; local_16c8 < 0x10; local_16c8 = local_16c8 + 1) {
    *(int *)(local_1600 + (long)local_16c8 * 4) = local_16a0[local_16c8];
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_single(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i counter = _mm256_set1_epi16(0);
    const __m256i one_mask =  _mm256_set1_epi16(1);
    // set_epi is parameterized backwards (15->0)
    const __m256i masks = _mm256_set_epi16(-32768, 1 << 14, 1 << 13, 1 << 12,
                                           1 << 11, 1 << 10, 1 << 9,  1 << 8,
                                           1 << 7,  1 << 6,  1 << 5,  1 << 4,
                                           1 << 3,  1 << 2,  1 << 1,  1 << 0);
    uint32_t out_counters[16] = {0};
    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_update_cycles = n_cycles / 4096;

#define UPDATE(idx) counter = _mm256_add_epi16(counter, _mm256_and_si256(_mm256_cmpeq_epi16(_mm256_and_si256(_mm256_set1_epi16(_mm256_extract_epi16(_mm256_loadu_si256(data_vectors+pos), idx)), masks), masks), one_mask));
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    uint32_t pos = 0;
    for (int i = 0; i < n_update_cycles; ++i) { // each block of 65536 values
        for (int k = 0; k < 4096; ++k, ++pos) { // max sum of each 16-bit value in a register (65536/16)
            BLOCK
        }

        // Compute vector sum
        // Unroll to prevent clang (LLVM) from throwing constant integer error such as:
        // error: argument to '__builtin_ia32_vec_ext_v16hi' must be a constant integer
        out_counters[0]  += _mm256_extract_epi16(counter,  0);
        out_counters[1]  += _mm256_extract_epi16(counter,  1);
        out_counters[2]  += _mm256_extract_epi16(counter,  2);
        out_counters[3]  += _mm256_extract_epi16(counter,  3);
        out_counters[4]  += _mm256_extract_epi16(counter,  4);
        out_counters[5]  += _mm256_extract_epi16(counter,  5);
        out_counters[6]  += _mm256_extract_epi16(counter,  6);
        out_counters[7]  += _mm256_extract_epi16(counter,  7);
        out_counters[8]  += _mm256_extract_epi16(counter,  8);
        out_counters[9]  += _mm256_extract_epi16(counter,  9);
        out_counters[10] += _mm256_extract_epi16(counter, 10);
        out_counters[11] += _mm256_extract_epi16(counter, 11);
        out_counters[12] += _mm256_extract_epi16(counter, 12);
        out_counters[13] += _mm256_extract_epi16(counter, 13);
        out_counters[14] += _mm256_extract_epi16(counter, 14);
        out_counters[15] += _mm256_extract_epi16(counter, 15);

        counter = _mm256_set1_epi16(0);
    }

#undef UPDATE
#undef BLOCK

    // residual
    for (int i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

    return 0;
}